

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CentralizedFileFormat.cpp
# Opt level: O3

JSONNode __thiscall ser::CentralizedFileFormat::GlobalInfoToJSON(CentralizedFileFormat *this)

{
  internalJSONNode *piVar1;
  long in_RSI;
  pointer *ppJVar2;
  vector<JSONNode,_std::allocator<JSONNode>_> local_40;
  
  piVar1 = internalJSONNode::newInternal('\x05');
  (this->super_FileFormat)._vptr_FileFormat = (_func_int **)piVar1;
  ppJVar2 = &local_40.super__Vector_base<JSONNode,_std::allocator<JSONNode>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  local_40.super__Vector_base<JSONNode,_std::allocator<JSONNode>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)ppJVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"GlobalMetainfo","");
  if (1 < piVar1->refcount) {
    piVar1->refcount = piVar1->refcount - 1;
    piVar1 = internalJSONNode::newInternal(piVar1);
  }
  (this->super_FileFormat)._vptr_FileFormat = (_func_int **)piVar1;
  std::__cxx11::string::_M_assign((string *)&piVar1->_name);
  piVar1->_name_encoded = true;
  if (local_40.super__Vector_base<JSONNode,_std::allocator<JSONNode>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)ppJVar2) {
    operator_delete(local_40.super__Vector_base<JSONNode,_std::allocator<JSONNode>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  MetainfoSet::GenerateNodes(&local_40,*(MetainfoSet **)(in_RSI + 0x58));
  piVar1 = (internalJSONNode *)(this->super_FileFormat)._vptr_FileFormat;
  for (ppJVar2 = (pointer *)
                 local_40.super__Vector_base<JSONNode,_std::allocator<JSONNode>_>._M_impl.
                 super__Vector_impl_data._M_start;
      (pointer)ppJVar2 !=
      local_40.super__Vector_base<JSONNode,_std::allocator<JSONNode>_>._M_impl.
      super__Vector_impl_data._M_finish; ppJVar2 = ppJVar2 + 1) {
    if (1 < piVar1->refcount) {
      piVar1->refcount = piVar1->refcount - 1;
      piVar1 = internalJSONNode::newInternal(piVar1);
    }
    internalJSONNode::push_back(piVar1,(JSONNode *)ppJVar2);
  }
  (this->super_FileFormat)._vptr_FileFormat = (_func_int **)piVar1;
  std::vector<JSONNode,_std::allocator<JSONNode>_>::~vector(&local_40);
  return (JSONNode)(internalJSONNode *)this;
}

Assistant:

JSONNode CentralizedFileFormat::GlobalInfoToJSON() const
{
    JSONNode node;
    node.set_name("GlobalMetainfo");

    const std::vector<JSONNode>& nodes = pGlobalMetainfo_->GenerateNodes();
    for (std::vector<JSONNode>::const_iterator iter = nodes.begin(); iter != nodes.end(); ++iter)
        node.push_back(*iter);

    return node;
}